

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_members_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::EliminateDeadMembersPass::UpdateCompositeInsert
          (EliminateDeadMembersPass *this,Instruction *inst)

{
  initializer_list<unsigned_int> init_list;
  Op OVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  DefUseManager *pDVar4;
  Instruction *pIVar5;
  Operand *__args;
  IRContext *pIVar6;
  bool bVar7;
  Instruction *type_inst;
  iterator local_d0;
  undefined8 local_c8;
  SmallVector<unsigned_int,_2UL> local_c0;
  Operand local_98;
  undefined4 local_68;
  uint32_t local_64;
  uint32_t local_60;
  uint32_t new_member_idx;
  uint32_t member_idx;
  uint32_t i_1;
  uint32_t i;
  bool modified;
  OperandList new_operands;
  uint32_t type_id;
  Instruction *composite_inst;
  uint32_t composite_id;
  uint32_t first_operand;
  Instruction *inst_local;
  EliminateDeadMembersPass *this_local;
  
  OVar1 = opt::Instruction::opcode(inst);
  bVar7 = true;
  if (OVar1 != OpCompositeInsert) {
    OVar1 = opt::Instruction::opcode(inst);
    bVar7 = false;
    if (OVar1 == OpSpecConstantOp) {
      uVar2 = opt::Instruction::GetSingleWordInOperand(inst,0);
      bVar7 = uVar2 == 0x52;
    }
  }
  if (!bVar7) {
    __assert_fail("inst->opcode() == spv::Op::OpCompositeInsert || (inst->opcode() == spv::Op::OpSpecConstantOp && spv::Op(inst->GetSingleWordInOperand(kSpecConstOpOpcodeIdx)) == spv::Op::OpCompositeInsert)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_members_pass.cpp"
                  ,0x269,
                  "bool spvtools::opt::EliminateDeadMembersPass::UpdateCompositeInsert(Instruction *)"
                 );
  }
  OVar1 = opt::Instruction::opcode(inst);
  composite_inst._4_4_ = (uint)(OVar1 == OpSpecConstantOp);
  uVar2 = opt::Instruction::GetSingleWordInOperand(inst,composite_inst._4_4_ + 1);
  pDVar4 = Pass::get_def_use_mgr((Pass *)this);
  pIVar5 = analysis::DefUseManager::GetDef(pDVar4,uVar2);
  new_operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = opt::Instruction::type_id(pIVar5);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&i);
  i_1._3_1_ = 0;
  for (member_idx = 0; member_idx < composite_inst._4_4_ + 2; member_idx = member_idx + 1) {
    __args = opt::Instruction::GetInOperand(inst,member_idx);
    std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
    emplace_back<spvtools::opt::Operand&>
              ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&i,__args);
  }
  new_member_idx = composite_inst._4_4_ + 2;
  do {
    uVar2 = new_member_idx;
    uVar3 = opt::Instruction::NumInOperands(inst);
    if (uVar3 <= uVar2) {
      if ((i_1._3_1_ & 1) == 0) {
        this_local._7_1_ = false;
      }
      else {
        opt::Instruction::SetInOperands(inst,(OperandList *)&i);
        pIVar6 = Pass::context((Pass *)this);
        IRContext::UpdateDefUse(pIVar6,inst);
        this_local._7_1_ = true;
      }
LAB_009b818b:
      local_68 = 1;
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&i);
      return this_local._7_1_;
    }
    local_60 = opt::Instruction::GetSingleWordInOperand(inst,new_member_idx);
    local_64 = GetNewMemberIndex(this,new_operands.
                                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                 local_60);
    if (local_64 == 0xffffffff) {
      pIVar6 = Pass::context((Pass *)this);
      IRContext::KillInst(pIVar6,inst);
      this_local._7_1_ = true;
      goto LAB_009b818b;
    }
    if (local_60 != local_64) {
      i_1._3_1_ = 1;
    }
    local_d0 = (iterator)((long)&type_inst + 4);
    local_c8 = 1;
    init_list._M_len = 1;
    init_list._M_array = local_d0;
    type_inst._4_4_ = local_64;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_c0,init_list);
    Operand::Operand(&local_98,SPV_OPERAND_TYPE_LITERAL_INTEGER,&local_c0);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
    emplace_back<spvtools::opt::Operand>
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&i,
               &local_98);
    Operand::~Operand(&local_98);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_c0);
    pDVar4 = Pass::get_def_use_mgr((Pass *)this);
    pIVar5 = analysis::DefUseManager::GetDef
                       (pDVar4,new_operands.
                               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    OVar1 = opt::Instruction::opcode(pIVar5);
    if ((OVar1 - OpTypeVector < 2) || (OVar1 - OpTypeArray < 2)) {
LAB_009b8106:
      new_operands.
      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           opt::Instruction::GetSingleWordInOperand(pIVar5,0);
    }
    else {
      if (OVar1 != OpTypeStruct) {
        if (((OVar1 != OpTypeCooperativeMatrixKHR) && (OVar1 != OpTypeCooperativeVectorNV)) &&
           (OVar1 != OpTypeCooperativeMatrixNV)) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_members_pass.cpp"
                        ,0x299,
                        "bool spvtools::opt::EliminateDeadMembersPass::UpdateCompositeInsert(Instruction *)"
                       );
        }
        goto LAB_009b8106;
      }
      new_operands.
      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           opt::Instruction::GetSingleWordInOperand(pIVar5,local_64);
    }
    new_member_idx = new_member_idx + 1;
  } while( true );
}

Assistant:

bool EliminateDeadMembersPass::UpdateCompositeInsert(Instruction* inst) {
  assert(inst->opcode() == spv::Op::OpCompositeInsert ||
         (inst->opcode() == spv::Op::OpSpecConstantOp &&
          spv::Op(inst->GetSingleWordInOperand(kSpecConstOpOpcodeIdx)) ==
              spv::Op::OpCompositeInsert));

  uint32_t first_operand = 0;
  if (inst->opcode() == spv::Op::OpSpecConstantOp) {
    first_operand = 1;
  }

  uint32_t composite_id = inst->GetSingleWordInOperand(first_operand + 1);
  Instruction* composite_inst = get_def_use_mgr()->GetDef(composite_id);
  uint32_t type_id = composite_inst->type_id();

  Instruction::OperandList new_operands;
  bool modified = false;

  for (uint32_t i = 0; i < first_operand + 2; ++i) {
    new_operands.emplace_back(inst->GetInOperand(i));
  }
  for (uint32_t i = first_operand + 2; i < inst->NumInOperands(); ++i) {
    uint32_t member_idx = inst->GetSingleWordInOperand(i);
    uint32_t new_member_idx = GetNewMemberIndex(type_id, member_idx);
    if (new_member_idx == kRemovedMember) {
      context()->KillInst(inst);
      return true;
    }

    if (member_idx != new_member_idx) {
      modified = true;
    }
    new_operands.emplace_back(
        Operand({SPV_OPERAND_TYPE_LITERAL_INTEGER, {new_member_idx}}));

    Instruction* type_inst = get_def_use_mgr()->GetDef(type_id);
    switch (type_inst->opcode()) {
      case spv::Op::OpTypeStruct:
        // The type will have already been rewritten, so use the new member
        // index.
        type_id = type_inst->GetSingleWordInOperand(new_member_idx);
        break;
      case spv::Op::OpTypeArray:
      case spv::Op::OpTypeRuntimeArray:
      case spv::Op::OpTypeVector:
      case spv::Op::OpTypeMatrix:
      case spv::Op::OpTypeCooperativeMatrixNV:
      case spv::Op::OpTypeCooperativeMatrixKHR:
      case spv::Op::OpTypeCooperativeVectorNV:
        type_id = type_inst->GetSingleWordInOperand(0);
        break;
      default:
        assert(false);
    }
  }

  if (!modified) {
    return false;
  }
  inst->SetInOperands(std::move(new_operands));
  context()->UpdateDefUse(inst);
  return true;
}